

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_future_acquire(green_future_t future)

{
  green_future_t future_local;
  
  if (future == (green_future_t)0x0) {
    future_local._4_4_ = 1;
  }
  else {
    if (future == (green_future_t)0x0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future != ((void*)0)",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x236);
      fflush(_stderr);
      abort();
    }
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x237);
      fflush(_stderr);
      abort();
    }
    future->refs = future->refs + 1;
    future_local._4_4_ = 0;
  }
  return future_local._4_4_;
}

Assistant:

int green_future_acquire(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    ++future->refs;
    return GREEN_SUCCESS;
}